

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::printfileinfo(ImgfsFile *this,string *romname)

{
  iterator iVar1;
  undefined8 *puVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>_>_>
          ::find(&(this->_files)._M_t,romname);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->_files)._M_t._M_impl.super__Rb_tree_header) {
    FileEntry::listentry(*(FileEntry **)(iVar1._M_node + 2),this);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "dump: not found";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

virtual void printfileinfo(const std::string&romname)
    {
        filemap_t::iterator fi= _files.find(romname);
        if (fi==_files.end())
            throw "dump: not found";

        (*fi).second->listentry(*this);
    }